

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-cached-powers.cpp
# Opt level: O1

void icu_63::double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange
               (int min_exponent,int max_exponent,DiyFp *power,int *decimal_exponent)

{
  int iVar1;
  short sVar2;
  uint64_t uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  dVar6 = ceil((double)(min_exponent + 0x3f) * 0.30102999566398114);
  iVar1 = (int)dVar6 + 0x15b;
  iVar4 = (int)dVar6 + 0x162;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  lVar5 = (long)(iVar4 >> 3) * 0x10;
  uVar3 = *(uint64_t *)(kCachedPowers + lVar5 + 0x10);
  sVar2 = *(short *)(kCachedPowers + lVar5 + 0x18);
  *decimal_exponent = (int)*(short *)(kCachedPowers + lVar5 + 0x1a);
  power->f_ = uVar3;
  power->e_ = (int)sVar2;
  return;
}

Assistant:

void PowersOfTenCache::GetCachedPowerForBinaryExponentRange(
    int min_exponent,
    int max_exponent,
    DiyFp* power,
    int* decimal_exponent) {
  int kQ = DiyFp::kSignificandSize;
  double k = ceil((min_exponent + kQ - 1) * kD_1_LOG2_10);
  int foo = kCachedPowersOffset;
  int index =
      (foo + static_cast<int>(k) - 1) / kDecimalExponentDistance + 1;
  ASSERT(0 <= index && index < static_cast<int>(ARRAY_SIZE(kCachedPowers)));
  CachedPower cached_power = kCachedPowers[index];
  ASSERT(min_exponent <= cached_power.binary_exponent);
  (void) max_exponent;  // Mark variable as used.
  ASSERT(cached_power.binary_exponent <= max_exponent);
  *decimal_exponent = cached_power.decimal_exponent;
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
}